

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O0

void read_number(char *p,option_t *opt)

{
  ushort **ppuVar1;
  undefined8 *in_RSI;
  char *in_RDI;
  int val;
  int local_14;
  char *local_8;
  
  local_14 = 0;
  local_8 = in_RDI;
  if (*in_RDI == '\0') {
    ccerr(E,"missing argument to \'%s\'",*in_RSI);
  }
  else {
    for (; *local_8 != '\0'; local_8 = local_8 + 1) {
      ppuVar1 = __ctype_b_loc();
      if (((*ppuVar1)[(int)*local_8] & 0x800) == 0) {
        ccerr(E,"argument to \'%s\' should be a non-negative integer.",*in_RSI);
        return;
      }
      local_14 = *local_8 + -0x30 + local_14 * 10;
    }
    *(int *)(in_RSI + 2) = local_14;
  }
  return;
}

Assistant:

void read_number(char* p, option_t* opt)
{
    int val = 0;

    if (!*p)
    {
        ccerr(E, "missing argument to '%s'", opt->name);
        return;
    }

    while (*p)
    {
        if (!isdigit(*p))
        {
            ccerr(E, "argument to '%s' should be a non-negative integer.",
                opt->name);
            return;
        }
        val *= 10;
        val += *p - '0';
        ++p;
    }

    opt->value.num = val;
}